

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O0

void sptk::world::interp1(double *x,double *y,int x_length,double *xi,int xi_length,double *yi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  int *index;
  double *in_RCX;
  int in_EDX;
  long in_RSI;
  double *in_RDI;
  int in_R8D;
  long in_R9;
  double s;
  int i_2;
  int i_1;
  int i;
  int *k;
  double *h;
  int local_4c;
  int local_48;
  int local_44;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(in_EDX + -1);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_R8D;
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  index = (int *)operator_new__(uVar3);
  for (local_44 = 0; local_44 < in_EDX + -1; local_44 = local_44 + 1) {
    *(double *)((long)pvVar4 + (long)local_44 * 8) = in_RDI[local_44 + 1] - in_RDI[local_44];
  }
  for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
    index[local_48] = 0;
  }
  histc(in_RDI,in_EDX,in_RCX,in_R8D,index);
  for (local_4c = 0; local_4c < in_R8D; local_4c = local_4c + 1) {
    *(double *)(in_R9 + (long)local_4c * 8) =
         ((in_RCX[local_4c] - in_RDI[index[local_4c] + -1]) /
         *(double *)((long)pvVar4 + (long)(index[local_4c] + -1) * 8)) *
         (*(double *)(in_RSI + (long)index[local_4c] * 8) -
         *(double *)(in_RSI + (long)(index[local_4c] + -1) * 8)) +
         *(double *)(in_RSI + (long)(index[local_4c] + -1) * 8);
  }
  if (index != (int *)0x0) {
    operator_delete__(index);
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  return;
}

Assistant:

void interp1(const double *x, const double *y, int x_length, const double *xi,
    int xi_length, double *yi) {
  double *h = new double[x_length - 1];
  int *k = new int[xi_length];

  for (int i = 0; i < x_length - 1; ++i) h[i] = x[i + 1] - x[i];
  for (int i = 0; i < xi_length; ++i) {
    k[i] = 0;
  }

  histc(x, x_length, xi, xi_length, k);

  for (int i = 0; i < xi_length; ++i) {
    double s = (xi[i] - x[k[i] - 1]) / h[k[i] - 1];
    yi[i] = y[k[i] - 1] + s * (y[k[i]] - y[k[i] - 1]);
  }

  delete[] k;
  delete[] h;
}